

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

uint64_t absl::lts_20240722::hash_internal::MixingHashState::CombineContiguousImpl
                   (uint64_t state,ulong *first,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  
  if (len < 0x11) {
    if (8 < len) {
      uVar5 = (*first << 0xb | *first >> 0x35) + state + 0x9ddfea08eb382d69;
      uVar3 = state + 0x9ddfea08eb382d69 ^ *(ulong *)((long)first + (len - 8));
      goto LAB_0010135d;
    }
    if (len < 4) {
      if (len == 0) {
        return state;
      }
      uVar3 = (ulong)((uint)*(byte *)((long)first + (len - 1)) << (((char)len + -1) * '\b' & 0x1fU)
                      | (uint)(byte)*first |
                     (uint)*(byte *)((long)first + (len >> 1)) <<
                     ((byte)((int)(len >> 1) << 3) & 0x1f));
    }
    else {
      uVar3 = (ulong)*(uint *)((long)first + (len - 4)) << ((char)((int)len << 3) - 0x20U & 0x3f) |
              (ulong)(uint)*first;
    }
  }
  else {
    if (0x400 < len) {
      uVar4 = CombineLargeContiguousImpl64(state,(uchar *)first,len);
      return uVar4;
    }
    uVar3 = absl::lts_20240722::hash_internal::LowLevelHashLenGt16
                      (first,len,(ulong)&kSeed,(ulong *)kHashSalt);
  }
  uVar3 = uVar3 + state;
  uVar5 = 0x9ddfea08eb382d69;
LAB_0010135d:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  return SUB168(auVar1 * auVar2,8) ^ SUB168(auVar1 * auVar2,0);
}

Assistant:

inline uint64_t MixingHashState::CombineContiguousImpl(
    uint64_t state, const unsigned char* first, size_t len,
    std::integral_constant<int, 8> /* sizeof_size_t */) {
  // For large values we use LowLevelHash or CityHash depending on the platform,
  // for small ones we just use a multiplicative hash.
  uint64_t v;
  if (len > 16) {
    if (ABSL_PREDICT_FALSE(len > PiecewiseChunkSize())) {
      return CombineLargeContiguousImpl64(state, first, len);
    }
    v = Hash64(first, len);
  } else if (len > 8) {
    // This hash function was constructed by the ML-driven algorithm discovery
    // using reinforcement learning. We fed the agent lots of inputs from
    // microbenchmarks, SMHasher, low hamming distance from generated inputs and
    // picked up the one that was good on micro and macrobenchmarks.
    auto p = Read9To16(first, len);
    uint64_t lo = p.first;
    uint64_t hi = p.second;
    // Rotation by 53 was found to be most often useful when discovering these
    // hashing algorithms with ML techniques.
    lo = absl::rotr(lo, 53);
    state += kMul;
    lo += state;
    state ^= hi;
    uint128 m = state;
    m *= lo;
    return static_cast<uint64_t>(m ^ (m >> 64));
  } else if (len >= 4) {
    v = Read4To8(first, len);
  } else if (len > 0) {
    v = Read1To3(first, len);
  } else {
    // Empty ranges have no effect.
    return state;
  }
  return Mix(state, v);
}